

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

int sf_sizeof(GlobalVars *gv,lword addr,lword *res)

{
  bool bVar1;
  LinkedSection *pLVar2;
  unsigned_long *in_RDX;
  GlobalVars *in_RSI;
  LinkedSection *ls;
  undefined8 in_stack_ffffffffffffffe0;
  
  bVar1 = startofblock((char)((ulong)in_stack_ffffffffffffffe0 >> 0x18));
  if (bVar1 != 0) {
    pLVar2 = getsection(in_RSI);
    if (pLVar2 != (LinkedSection *)0x0) {
      *in_RDX = pLVar2->size;
    }
    endofblock((char)((ulong)pLVar2 >> 0x18),(char)((ulong)pLVar2 >> 0x10));
  }
  return 1;
}

Assistant:

static int sf_sizeof(struct GlobalVars *gv,lword addr,lword *res)
{
  struct LinkedSection *ls;

  if (startofblock('(')) {
    if (ls = getsection(gv))
      *res = ls->size;
    endofblock('(',')');
  }
  return 1;
}